

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipclisten.c
# Opt level: O1

int ipc_listener_listen(void *arg)

{
  nni_sockaddr *na;
  nni_mtx *mtx;
  bool bVar1;
  int __fd;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *path;
  int *piVar5;
  undefined1 local_b8 [8];
  sockaddr_storage ss;
  socklen_t len;
  
  na = (nni_sockaddr *)((long)arg + 0x88);
  sVar4 = nni_posix_nn2sockaddr(local_b8,na);
  ss.__ss_align._4_4_ = (uint)sVar4;
  if ((sVar4 & 0xfffffffe) == 0) {
    return 0xf;
  }
  mtx = (nni_mtx *)((long)arg + 0x140);
  nni_mtx_lock(mtx);
  if (*(char *)((long)arg + 0x128) == '\x01') {
    nni_mtx_unlock(mtx);
    return 0xb;
  }
  if (*(char *)((long)arg + 0x129) == '\x01') {
    nni_mtx_unlock(mtx);
    return 7;
  }
  if (na->s_family == 5) {
    path = (char *)0x0;
  }
  else {
    if (na->s_family != 2) {
      nni_mtx_unlock(mtx);
      return 0xf;
    }
    path = nni_strdup((char *)((long)arg + 0x8a));
    if (path == (char *)0x0) {
      nni_mtx_unlock(mtx);
      return 2;
    }
  }
  iVar2 = socket(1,0x80001,0);
  if (iVar2 < 0) {
    piVar5 = __errno_location();
    iVar2 = nni_plat_errno(*piVar5);
    nni_mtx_unlock(mtx);
    goto LAB_00131273;
  }
  ss.__ss_align._0_4_ = iVar2;
  iVar2 = bind(iVar2,(sockaddr *)local_b8,ss.__ss_align._4_4_);
  bVar1 = true;
  if (iVar2 != 0) {
    if (na->s_family == 2) {
      piVar5 = __errno_location();
      if ((*piVar5 == 0x62) || (*piVar5 == 0x11)) {
        ipc_remove_stale(path);
        iVar2 = bind((int)ss.__ss_align,(sockaddr *)local_b8,ss.__ss_align._4_4_);
        if (iVar2 == 0) goto LAB_00131203;
      }
    }
    nni_strfree(path);
    path = (char *)0x0;
    bVar1 = false;
  }
LAB_00131203:
  if ((bVar1) &&
     ((((path == (char *)0x0 || (*(uint *)((long)arg + 0x138) == 0)) ||
       (iVar2 = chmod(path,*(uint *)((long)arg + 0x138) & 0xffff0fff), iVar2 == 0)) &&
      (iVar2 = listen((int)ss.__ss_align,0x80), iVar2 == 0)))) {
    iVar2 = 0;
  }
  else {
    piVar5 = __errno_location();
    iVar2 = nni_plat_errno(*piVar5);
  }
  __fd = (int)ss.__ss_align;
  if (iVar2 == 0) {
    nni_posix_pfd_init((nni_posix_pfd *)((long)arg + 0x50),(int)ss.__ss_align,ipc_listener_cb,arg);
    if ((*(short *)((long)arg + 0x88) == 5) && (*(short *)((long)arg + 0x8a) == 0)) {
      ss.__ss_align._4_4_ = 0x80;
      iVar2 = getsockname(__fd,(sockaddr *)local_b8,(socklen_t *)((long)&ss.__ss_align + 4));
      if ((iVar2 == 0) && ((uVar3 = ss.__ss_align._4_4_ - 3, uVar3 < 0x69 && (local_b8[2] == '\0')))
         ) {
        *(short *)((long)arg + 0x8a) = (short)uVar3;
        ss.__ss_align._4_4_ = uVar3;
        memcpy((void *)((long)arg + 0x8c),local_b8 + 3,(ulong)uVar3);
      }
    }
    *(undefined1 *)((long)arg + 0x128) = 1;
    *(char **)((long)arg + 0x130) = path;
    nni_mtx_unlock(mtx);
    return 0;
  }
  nni_mtx_unlock(mtx);
  close((int)ss.__ss_align);
  if (path != (char *)0x0) {
    unlink(path);
  }
LAB_00131273:
  nni_strfree(path);
  return iVar2;
}

Assistant:

int
ipc_listener_listen(void *arg)
{
	ipc_listener           *l = arg;
	socklen_t               len;
	struct sockaddr_storage ss;
	int                     rv;
	int                     fd;
	char                   *path;

	if ((len = nni_posix_nn2sockaddr(&ss, &l->sa)) < sizeof(sa_family_t)) {
		return (NNG_EADDRINVAL);
	}

	nni_mtx_lock(&l->mtx);
	if (l->started) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ESTATE);
	}
	if (l->closed) {
		nni_mtx_unlock(&l->mtx);
		return (NNG_ECLOSED);
	}

	switch (l->sa.s_family) {
	case NNG_AF_IPC:
		if ((path = nni_strdup(l->sa.s_ipc.sa_path)) == NULL) {
			nni_mtx_unlock(&l->mtx);
			return (NNG_ENOMEM);
		}
		break;
	case NNG_AF_ABSTRACT:
		path = NULL;
		break;
	default:
		nni_mtx_unlock(&l->mtx);
		return (NNG_EADDRINVAL);
	}

	if ((fd = socket(AF_UNIX, SOCK_STREAM | SOCK_CLOEXEC, 0)) < 0) {
		rv = nni_plat_errno(errno);
		nni_mtx_unlock(&l->mtx);
		nni_strfree(path);
		return (rv);
	}

	if ((rv = bind(fd, (struct sockaddr *) &ss, len)) != 0) {
		if ((l->sa.s_family == NNG_AF_IPC) &&
		    ((errno == EEXIST) || (errno == EADDRINUSE))) {
			ipc_remove_stale(path);
			rv = bind(fd, (struct sockaddr *) &ss, len);
		}
		if (rv != 0) {
			nni_strfree(path);
			path = NULL;
		}
	}

	if ((rv != 0) || (ipc_listener_chmod(l, path) != 0) ||
	    (listen(fd, 128) != 0)) {
		rv = nni_plat_errno(errno);
	}
	if (rv != 0) {
		nni_mtx_unlock(&l->mtx);
		(void) close(fd);
		if (path != NULL) {
			unlink(path);
		}
		nni_strfree(path);
		return (rv);
	}

	nni_posix_pfd_init(&l->pfd, fd, ipc_listener_cb, l);

#ifdef NNG_HAVE_ABSTRACT_SOCKETS
	// If the original address was for a system assigned value,
	// then figure out what we got.  This is analogous to TCP
	// binding to port 0.
	if ((l->sa.s_family == NNG_AF_ABSTRACT) &&
	    (l->sa.s_abstract.sa_len == 0)) {
		struct sockaddr_un *su = (void *) &ss;
		len                    = sizeof(ss);
		if ((getsockname(fd, (struct sockaddr *) &ss, &len) == 0) &&
		    (len > sizeof(sa_family_t)) &&
		    (len <= sizeof(l->sa.s_abstract.sa_name)) &&
		    (su->sun_path[0] == '\0')) {
			len -= sizeof(sa_family_t);
			len--; // don't count the leading NUL.
			l->sa.s_abstract.sa_len = len;
			memcpy(
			    l->sa.s_abstract.sa_name, &su->sun_path[1], len);
		}
	}
#endif

	l->started = true;
	l->path    = path;
	nni_mtx_unlock(&l->mtx);

	return (0);
}